

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdInitializeTxDataHandle(void *handle,int net_type,char *tx_hex_string,void **tx_data_handle)

{
  bool bVar1;
  void *pvVar2;
  ConfidentialTransactionContext *this;
  CfdException *pCVar3;
  bool is_bitcoin;
  allocator local_55;
  int net_type_local;
  undefined1 local_50 [32];
  
  net_type_local = net_type;
  cfd::Initialize();
  if (tx_data_handle == (void **)0x0) {
    local_50._0_8_ = "cfdcapi_transaction.cpp";
    local_50._8_4_ = 0xd7d;
    local_50._16_8_ = "CfdInitializeTxDataHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_50,"tx data handle is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_50,"Failed to parameter. tx data handle is null.",
               (allocator *)&is_bitcoin);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_50);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    is_bitcoin = false;
    cfd::capi::ConvertNetType(net_type_local,&is_bitcoin);
    if (is_bitcoin == false) {
      local_50._0_8_ = "cfdcapi_transaction.cpp";
      local_50._8_4_ = 0xd8d;
      local_50._16_8_ = "CfdInitializeTxDataHandle";
      cfd::core::logger::info<int&>((CfdSourceLocation *)local_50,"net_type[{}]",&net_type_local);
    }
    std::__cxx11::string::string((string *)local_50,"TransactionData",&local_55);
    pvVar2 = cfd::capi::AllocBuffer((string *)local_50,0x20);
    std::__cxx11::string::~string((string *)local_50);
    *(int *)((long)pvVar2 + 0x10) = net_type_local;
    if (is_bitcoin == true) {
      this = (ConfidentialTransactionContext *)operator_new(0xb8);
      std::__cxx11::string::string((string *)local_50,tx_hex_string,&local_55);
      cfd::TransactionContext::TransactionContext((TransactionContext *)this,(string *)local_50);
    }
    else {
      this = (ConfidentialTransactionContext *)operator_new(0xb8);
      std::__cxx11::string::string((string *)local_50,tx_hex_string,&local_55);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(this,(string *)local_50);
    }
    std::__cxx11::string::~string((string *)local_50);
    *(ConfidentialTransactionContext **)((long)pvVar2 + 0x18) = this;
    *tx_data_handle = pvVar2;
    return 0;
  }
  local_50._0_8_ = "cfdcapi_transaction.cpp";
  local_50._8_4_ = 0xd83;
  local_50._16_8_ = "CfdInitializeTxDataHandle";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_50,"tx_hex is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_50,"Failed to parameter. tx_hex is null or empty.",
             (allocator *)&is_bitcoin);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeTxDataHandle(
    void* handle, int net_type, const char* tx_hex_string,
    void** tx_data_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiTransactionData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (tx_data_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "tx data handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx data handle is null.");
    }
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_hex is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (!is_bitcoin) {
#ifndef CFD_DISABLE_ELEMENTS
      info(CFD_LOG_SOURCE, "net_type[{}]", net_type);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    buffer = static_cast<CfdCapiTransactionData*>(
        AllocBuffer(kPrefixTransactionData, sizeof(CfdCapiTransactionData)));
    buffer->net_type = net_type;
    if (is_bitcoin) {
      TransactionContext* tx =
          new TransactionContext(std::string(tx_hex_string));
      buffer->tx_obj = tx;
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          new ConfidentialTransactionContext(std::string(tx_hex_string));
      buffer->tx_obj = tx;
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    *tx_data_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  CfdFreeTxDataHandle(handle, buffer);
  return result;
}